

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam000000000019e2d0 = 0x2d2d2d2d2d2d2d;
    uRam000000000019e2d7._0_1_ = '-';
    uRam000000000019e2d7._1_1_ = '-';
    uRam000000000019e2d7._2_1_ = '-';
    uRam000000000019e2d7._3_1_ = '-';
    uRam000000000019e2d7._4_1_ = '-';
    uRam000000000019e2d7._5_1_ = '-';
    uRam000000000019e2d7._6_1_ = '-';
    uRam000000000019e2d7._7_1_ = '-';
    DAT_0019e2c0 = '-';
    DAT_0019e2c0_1._0_1_ = '-';
    DAT_0019e2c0_1._1_1_ = '-';
    DAT_0019e2c0_1._2_1_ = '-';
    DAT_0019e2c0_1._3_1_ = '-';
    DAT_0019e2c0_1._4_1_ = '-';
    DAT_0019e2c0_1._5_1_ = '-';
    DAT_0019e2c0_1._6_1_ = '-';
    uRam000000000019e2c8 = 0x2d2d2d2d2d2d2d;
    DAT_0019e2cf = 0x2d;
    DAT_0019e2b0 = '-';
    DAT_0019e2b0_1._0_1_ = '-';
    DAT_0019e2b0_1._1_1_ = '-';
    DAT_0019e2b0_1._2_1_ = '-';
    DAT_0019e2b0_1._3_1_ = '-';
    DAT_0019e2b0_1._4_1_ = '-';
    DAT_0019e2b0_1._5_1_ = '-';
    DAT_0019e2b0_1._6_1_ = '-';
    uRam000000000019e2b8._0_1_ = '-';
    uRam000000000019e2b8._1_1_ = '-';
    uRam000000000019e2b8._2_1_ = '-';
    uRam000000000019e2b8._3_1_ = '-';
    uRam000000000019e2b8._4_1_ = '-';
    uRam000000000019e2b8._5_1_ = '-';
    uRam000000000019e2b8._6_1_ = '-';
    uRam000000000019e2b8._7_1_ = '-';
    DAT_0019e2a0 = '-';
    DAT_0019e2a0_1._0_1_ = '-';
    DAT_0019e2a0_1._1_1_ = '-';
    DAT_0019e2a0_1._2_1_ = '-';
    DAT_0019e2a0_1._3_1_ = '-';
    DAT_0019e2a0_1._4_1_ = '-';
    DAT_0019e2a0_1._5_1_ = '-';
    DAT_0019e2a0_1._6_1_ = '-';
    uRam000000000019e2a8._0_1_ = '-';
    uRam000000000019e2a8._1_1_ = '-';
    uRam000000000019e2a8._2_1_ = '-';
    uRam000000000019e2a8._3_1_ = '-';
    uRam000000000019e2a8._4_1_ = '-';
    uRam000000000019e2a8._5_1_ = '-';
    uRam000000000019e2a8._6_1_ = '-';
    uRam000000000019e2a8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam000000000019e298._0_1_ = '-';
    uRam000000000019e298._1_1_ = '-';
    uRam000000000019e298._2_1_ = '-';
    uRam000000000019e298._3_1_ = '-';
    uRam000000000019e298._4_1_ = '-';
    uRam000000000019e298._5_1_ = '-';
    uRam000000000019e298._6_1_ = '-';
    uRam000000000019e298._7_1_ = '-';
    DAT_0019e2df = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}